

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O2

bool __thiscall
async_simple::coro::detail::LazyAwaiterBase<bool>::awaitResume(LazyAwaiterBase<bool> *this)

{
  bool bVar1;
  bool *pbVar2;
  
  pbVar2 = LazyPromise<bool>::result((LazyPromise<bool> *)((long)(this->_handle).__handle_ + 0x10));
  bVar1 = *pbVar2;
  (**(code **)((long)(this->_handle).__handle_ + 8))();
  (this->_handle).__handle_ = (void *)0x0;
  return bVar1;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }